

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void copy_stemmer(char *zIn,int nIn,char *zOut,int *pnOut)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  
  if (nIn < 1) {
    uVar6 = 0;
    uVar5 = 10;
  }
  else {
    uVar6 = 0;
    bVar3 = false;
    do {
      bVar1 = zIn[uVar6];
      bVar2 = bVar3;
      if ((byte)(bVar1 - 0x30) < 10) {
        bVar2 = true;
      }
      if ((byte)(bVar1 + 0xbf) < 0x1a) {
        bVar1 = bVar1 | 0x20;
        bVar2 = bVar3;
      }
      zOut[uVar6] = bVar1;
      uVar6 = uVar6 + 1;
      bVar3 = bVar2;
    } while ((uint)nIn != uVar6);
    uVar5 = 3;
    if (!bVar2) {
      uVar5 = 10;
    }
    uVar6 = (ulong)(uint)nIn;
  }
  if ((int)(uVar5 * 2) < nIn) {
    lVar4 = (long)(int)(nIn - uVar5);
    uVar6 = (ulong)uVar5;
    do {
      zOut[uVar6] = zOut[lVar4];
      lVar4 = lVar4 + 1;
      uVar6 = uVar6 + 1;
    } while (lVar4 < (long)(ulong)(uint)nIn);
  }
  zOut[(int)uVar6] = '\0';
  *pnOut = (int)uVar6;
  return;
}

Assistant:

static void copy_stemmer(const char *zIn, int nIn, char *zOut, int *pnOut){
  int i, mx, j;
  int hasDigit = 0;
  for(i=0; i<nIn; i++){
    char c = zIn[i];
    if( c>='A' && c<='Z' ){
      zOut[i] = c - 'A' + 'a';
    }else{
      if( c>='0' && c<='9' ) hasDigit = 1;
      zOut[i] = c;
    }
  }
  mx = hasDigit ? 3 : 10;
  if( nIn>mx*2 ){
    for(j=mx, i=nIn-mx; i<nIn; i++, j++){
      zOut[j] = zOut[i];
    }
    i = j;
  }
  zOut[i] = 0;
  *pnOut = i;
}